

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

void xmlCleanupRMutex(xmlRMutexPtr tok)

{
  pthread_mutex_destroy((pthread_mutex_t *)tok);
  pthread_cond_destroy((pthread_cond_t *)&tok->cv);
  return;
}

Assistant:

void
xmlCleanupRMutex(xmlRMutexPtr tok) {
    (void) tok;

#ifdef HAVE_POSIX_THREADS
    pthread_mutex_destroy(&tok->lock);
    pthread_cond_destroy(&tok->cv);
#elif defined HAVE_WIN32_THREADS
    DeleteCriticalSection(&tok->cs);
#endif
}